

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O1

void crnlib::
     vector<crnlib::hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>::raw_node>
     ::object_mover(void *pDst_void,void *pSrc_void,uint num)

{
  long lVar1;
  raw_node *pSrc;
  bool bVar2;
  
  if (num != 0) {
    lVar1 = 0;
    do {
      bVar2 = *(char *)((long)pSrc_void + lVar1 + 8) != '\0';
      if (bVar2) {
        *(undefined8 *)((long)pDst_void + lVar1) = *(undefined8 *)((long)pSrc_void + lVar1);
      }
      *(bool *)((long)pDst_void + lVar1 + 8) = bVar2;
      lVar1 = lVar1 + 0xc;
    } while ((ulong)num * 0xc != lVar1);
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num) {
    T* pSrc = static_cast<T*>(pSrc_void);
    T* const pSrc_end = pSrc + num;
    T* pDst = static_cast<T*>(pDst_void);

    while (pSrc != pSrc_end) {
      // placement new
      new (static_cast<void*>(pDst)) T(*pSrc);
      pSrc->~T();
      ++pSrc;
      ++pDst;
    }
  }